

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::WriteUnitySourceInclude
          (cmLocalGenerator *this,ostream *unity_file,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cond,string *sf_full_path,cmValue beforeInclude,cmValue afterInclude,cmValue uniqueIdName
          )

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *b;
  string *b_00;
  string_view input;
  string pathToHash;
  string path;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char *local_70;
  size_t local_68;
  char local_60 [16];
  string local_50;
  
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    poVar2 = std::operator<<(unity_file,"#if ");
    poVar2 = std::operator<<(poVar2,(string *)cond);
    std::operator<<(poVar2,"\n");
  }
  if ((uniqueIdName.Value == (string *)0x0) || ((uniqueIdName.Value)->_M_string_length == 0))
  goto LAB_001ad7e4;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = '\0';
  cmsys::SystemTools::GetFilenamePath(&local_50,sf_full_path);
  psVar3 = GetBinaryDirectory_abi_cxx11_(this);
  bVar1 = WriteUnitySourceInclude::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&local_50,psVar3,b);
  if (bVar1) {
    psVar3 = GetBinaryDirectory_abi_cxx11_(this);
    cmSystemTools::RelativePath(&local_b0,psVar3,sf_full_path);
    std::operator+(&local_90,"BLD_",&local_b0);
LAB_001ad6a2:
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    psVar3 = &local_b0;
  }
  else {
    psVar3 = GetSourceDirectory_abi_cxx11_(this);
    bVar1 = WriteUnitySourceInclude::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_50,psVar3,b_00);
    if (bVar1) {
      psVar3 = GetSourceDirectory_abi_cxx11_(this);
      cmSystemTools::RelativePath(&local_b0,psVar3,sf_full_path);
      std::operator+(&local_90,"SRC_",&local_b0);
      goto LAB_001ad6a2;
    }
    std::operator+(&local_90,"ABS_",sf_full_path);
    psVar3 = &local_90;
    std::__cxx11::string::operator=((string *)&local_70,(string *)psVar3);
  }
  std::__cxx11::string::~string((string *)psVar3);
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_b0,AlgoMD5);
  poVar2 = std::operator<<(unity_file,"/* ");
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2," */\n");
  poVar2 = std::operator<<(poVar2,"#undef ");
  poVar2 = std::operator<<(poVar2,(string *)uniqueIdName.Value);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#define ");
  poVar2 = std::operator<<(poVar2,(string *)uniqueIdName.Value);
  poVar2 = std::operator<<(poVar2," unity_");
  input._M_str = local_70;
  input._M_len = local_68;
  cmCryptoHash::HashString_abi_cxx11_(&local_90,(cmCryptoHash *)&local_b0,input);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
LAB_001ad7e4:
  if (beforeInclude.Value != (string *)0x0) {
    poVar2 = std::operator<<(unity_file,(string *)beforeInclude.Value);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<(unity_file,"/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n");
  poVar2 = std::operator<<(unity_file,"#include \"");
  poVar2 = std::operator<<(poVar2,(string *)sf_full_path);
  std::operator<<(poVar2,"\"\n");
  if (afterInclude.Value != (string *)0x0) {
    poVar2 = std::operator<<(unity_file,(string *)afterInclude.Value);
    std::operator<<(poVar2,"\n");
  }
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::operator<<(unity_file,"#endif\n");
  }
  std::operator<<(unity_file,"\n");
  return;
}

Assistant:

void cmLocalGenerator::WriteUnitySourceInclude(
  std::ostream& unity_file, cm::optional<std::string> const& cond,
  std::string const& sf_full_path, cmValue beforeInclude, cmValue afterInclude,
  cmValue uniqueIdName) const
{
  if (cond) {
    unity_file << "#if " << *cond << "\n";
  }

  if (cmNonempty(uniqueIdName)) {
    std::string pathToHash;
    auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
      return (cmSystemTools::ComparePath(a, b) ||
              cmSystemTools::IsSubDirectory(a, b));
    };
    const auto path = cmSystemTools::GetFilenamePath(sf_full_path);
    if (PathEqOrSubDir(path, this->GetBinaryDirectory())) {
      pathToHash = "BLD_" +
        cmSystemTools::RelativePath(this->GetBinaryDirectory(), sf_full_path);
    } else if (PathEqOrSubDir(path, this->GetSourceDirectory())) {
      pathToHash = "SRC_" +
        cmSystemTools::RelativePath(this->GetSourceDirectory(), sf_full_path);
    } else {
      pathToHash = "ABS_" + sf_full_path;
    }
    cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
    unity_file << "/* " << pathToHash << " */\n"
               << "#undef " << *uniqueIdName << "\n"
               << "#define " << *uniqueIdName << " unity_"
               << hasher.HashString(pathToHash) << "\n";
  }

  if (beforeInclude) {
    unity_file << *beforeInclude << "\n";
  }

  unity_file << "/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n";
  unity_file << "#include \"" << sf_full_path << "\"\n";

  if (afterInclude) {
    unity_file << *afterInclude << "\n";
  }
  if (cond) {
    unity_file << "#endif\n";
  }
  unity_file << "\n";
}